

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O0

void __thiscall
xray_re::xr_mesh_builder::remove_back_faces(xr_mesh_builder *this,float normal_tolerance)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer this_00;
  b_face *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32_t uVar6;
  size_type __n;
  ulong uVar7;
  uint *__first;
  pointer pbVar8;
  reference pvVar9;
  reference pvVar10;
  pointer pbVar11;
  reference __src;
  reference __dest;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_150;
  const_iterator local_148;
  const_iterator local_140;
  int local_134;
  iterator iStack_130;
  int side_1;
  b_face_vec_it end_1;
  b_face_vec_it it_1;
  b_face_vec_it last;
  uint_fast32_t temp;
  ulong local_108;
  uint_fast32_t next_back;
  reference pvStack_f8;
  bool same_layer;
  b_face *adjacent;
  uint_fast32_t next_1;
  b_edge *edge;
  uint_fast32_t v1;
  uint_fast32_t v0;
  uint_fast32_t i;
  b_face *face_1;
  ulong uStack_b8;
  int side;
  size_t k;
  uint *puStack_a8;
  uint32_t lgroup;
  uint32_t *lgroups;
  vector<int,_std::allocator<int>_> sides;
  undefined1 local_78 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjacents;
  b_face *face;
  uint_fast32_t next;
  __normal_iterator<const_xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_48;
  b_face_vec_cit end;
  __normal_iterator<const_xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_38;
  b_face_vec_cit it;
  uint32_t face_idx;
  uint32_t *face_backs;
  size_t num_faces;
  float normal_tolerance_local;
  xr_mesh_builder *this_local;
  
  generate_vertex_faces(this);
  __n = std::
        vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
        ::size(&this->m_faces);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = __n;
  uVar7 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  __first = (uint *)operator_new__(uVar7);
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,unsigned_int>(__first,__n,&BAD_IDX);
  it._M_current._4_4_ = 0;
  end._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       begin(&this->m_faces);
  __gnu_cxx::
  __normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
  ::__normal_iterator<xray_re::xr_mesh_builder::b_face*>
            ((__normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
              *)&local_38,
             (__normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
              *)&end);
  next = (uint_fast32_t)
         std::
         vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
         ::end(&this->m_faces);
  __gnu_cxx::
  __normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
  ::__normal_iterator<xray_re::xr_mesh_builder::b_face*>
            ((__normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
              *)&local_48,
             (__normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
              *)&next);
  while (bVar4 = __gnu_cxx::operator!=(&local_38,&local_48), bVar4) {
    pbVar8 = __gnu_cxx::
             __normal_iterator<const_xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&local_38);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_vertex_faces,(ulong)(pbVar8->field_0).field_0.v[0]);
    uVar5 = *pvVar9;
    while (face = (b_face *)(ulong)uVar5, face != (b_face *)0xffffffff) {
      adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                    ::operator[](&this->m_faces,(size_type)face);
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
               ::operator->(&local_38);
      bVar4 = b_face::is_back(pbVar8,(b_face *)
                                     adjacents.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              &this->m_normals,normal_tolerance);
      this_00 = adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      if (bVar4) {
        __first[it._M_current._4_4_] = uVar5;
        __first[(long)face] = it._M_current._4_4_;
        break;
      }
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
               ::operator->(&local_38);
      uVar5 = b_face::next_face_idx((b_face *)this_00,(ulong)(pbVar8->field_0).field_0.v[0]);
    }
    __gnu_cxx::
    __normal_iterator<const_xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
    ::operator++(&local_38);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  create_edges(this,false);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0x200);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&lgroups);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&lgroups,0x100);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = __n;
  uVar7 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  puStack_a8 = (uint *)operator_new__(uVar7);
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,unsigned_int>(puStack_a8,__n,&BAD_IDX);
  k._4_4_ = 0;
  uStack_b8 = 0;
LAB_001ebf55:
  if (uStack_b8 != __n) {
    if ((__first[uStack_b8] != 0xffffffff) && (puStack_a8[uStack_b8] == 0xffffffff)) {
      face_1._4_4_ = 0;
      it._M_current._4_4_ = (value_type)uStack_b8;
      puStack_a8[uStack_b8 & 0xffffffff] = k._4_4_;
      puStack_a8[__first[uStack_b8 & 0xffffffff]] = k._4_4_ + 1;
      do {
        i = (uint_fast32_t)
            std::
            vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ::operator[](&this->m_faces,(ulong)it._M_current._4_4_);
        v0 = 3;
        edge = (b_edge *)(ulong)(((reference)i)->field_0).field_0.v[0];
        while (v0 != 0) {
          v1 = (uint_fast32_t)*(uint *)((i - 4) + v0 * 4);
          v0 = v0 - 1;
          next_1 = (uint_fast32_t)find_edge(this,v1,(uint_fast32_t)edge);
          bVar4 = false;
          if (((b_edge *)next_1 != (b_edge *)0x0) && (bVar4 = true, v1 != ((b_edge *)next_1)->v1)) {
            bVar4 = edge == (b_edge *)(ulong)((b_edge *)next_1)->v1;
          }
          if (!bVar4) {
            __assert_fail("edge && (v0 == edge->v1 || v1 == edge->v1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.cxx"
                          ,0x14c,"void xray_re::xr_mesh_builder::remove_back_faces(float)");
          }
          if (((b_edge *)next_1)->size < 5) {
            pbVar3 = (b_face *)(ulong)((b_edge *)next_1)->face0;
            while (adjacent = pbVar3, adjacent != (b_face *)0xffffffff) {
              pvStack_f8 = std::
                           vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                           ::operator[](&this->m_faces,(size_type)adjacent);
              if (((adjacent != (b_face *)(ulong)it._M_current._4_4_) &&
                  (adjacent != (b_face *)(ulong)__first[it._M_current._4_4_])) &&
                 (puStack_a8[(long)adjacent] == 0xffffffff)) {
                next_back._7_1_ = b_face::is_same_layer(pvStack_f8,v1,(uint_fast32_t)edge);
                local_108 = (ulong)__first[(long)adjacent];
                if (local_108 != 0xffffffff) {
                  if ((bool)next_back._7_1_) {
                    temp._4_4_ = adjacent._0_4_;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,
                               (value_type_conflict2 *)((long)&temp + 4));
                    puStack_a8[(long)adjacent] = k._4_4_;
                    puStack_a8[local_108] = k._4_4_ + 1;
                  }
                  else {
                    temp._0_4_ = __first[(long)adjacent];
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,
                               (value_type_conflict2 *)&temp);
                    puStack_a8[local_108] = k._4_4_;
                    puStack_a8[(long)adjacent] = k._4_4_ + 1;
                  }
                  break;
                }
                if (3 < *(ushort *)(next_1 + 0xc)) break;
                if ((bool)next_back._7_1_) {
                  face_1._4_4_ = face_1._4_4_ + -1;
                }
                else {
                  face_1._4_4_ = face_1._4_4_ + 1;
                }
              }
              uVar6 = b_face::next_face_idx(pvStack_f8,v1,(uint_fast32_t)edge);
              pbVar3 = (b_face *)(ulong)uVar6;
              if (adjacent == (b_face *)(ulong)uVar6) break;
            }
          }
          edge = (b_edge *)v1;
        }
        bVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        if (bVar4) goto LAB_001ec3a8;
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
        it._M_current._4_4_ = *pvVar9;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      } while( true );
    }
    goto LAB_001ec3df;
  }
  it._M_current._4_4_ = 0;
  end_1._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       begin(&this->m_faces);
  it_1._M_current = end_1._M_current;
  iStack_130 = std::
               vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ::end(&this->m_faces);
  do {
    bVar4 = __gnu_cxx::operator!=(&end_1,&stack0xfffffffffffffed0);
    if (!bVar4) {
      __gnu_cxx::
      __normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
      ::__normal_iterator<xray_re::xr_mesh_builder::b_face*>
                ((__normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
                  *)&local_140,&it_1);
      local_150._M_current =
           (b_face *)
           std::
           vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ::end(&this->m_faces);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
      ::__normal_iterator<xray_re::xr_mesh_builder::b_face*>
                ((__normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
                  *)&local_148,&local_150);
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      erase(&this->m_faces,local_140,local_148);
      if (puStack_a8 != (uint *)0x0) {
        operator_delete__(puStack_a8);
      }
      if (__first != (uint *)0x0) {
        operator_delete__(__first);
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&lgroups)
      ;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
      return;
    }
    if (__first[it._M_current._4_4_] == 0xffffffff) {
LAB_001ec4d7:
      bVar4 = __gnu_cxx::operator!=(&it_1,&end_1);
      if (bVar4) {
        __src = __gnu_cxx::
                __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                ::operator*(&end_1);
        __dest = __gnu_cxx::
                 __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                 ::operator*(&it_1);
        memcpy(__dest,__src,0x40);
      }
      __gnu_cxx::
      __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
      ::operator++(&it_1);
    }
    else {
      k._4_4_ = puStack_a8[it._M_current._4_4_];
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&lgroups,(ulong)(k._4_4_ >> 1));
      local_134 = *pvVar10;
      if ((k._4_4_ & 1) != 0) {
        local_134 = -local_134;
      }
      if (local_134 < 0) {
        pbVar11 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                  ::operator->(&end_1);
        *(ushort *)((long)&pbVar11->field_1 + 6) = *(ushort *)((long)&pbVar11->field_1 + 6) | 8;
        goto LAB_001ec4d7;
      }
    }
    __gnu_cxx::
    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
    ::operator++(&end_1);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  } while( true );
LAB_001ec3a8:
  if (face_1._4_4_ == 0) {
    face_1._4_4_ = -1;
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)&lgroups,
             (value_type_conflict7 *)((long)&face_1 + 4));
  k._4_4_ = k._4_4_ + 2;
LAB_001ec3df:
  uStack_b8 = uStack_b8 + 1;
  goto LAB_001ebf55;
}

Assistant:

void xr_mesh_builder::remove_back_faces(float normal_tolerance)
{
	generate_vertex_faces();

	size_t num_faces = m_faces.size();

	uint32_t* face_backs = new uint32_t[num_faces];
	xr_uninitialized_fill_n(face_backs, num_faces, BAD_IDX);
	uint32_t face_idx = 0;
	for (b_face_vec_cit it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		for (uint_fast32_t next = m_vertex_faces[it->v0]; next != BAD_IDX;) {
			b_face& face = m_faces[next];
			if (it->is_back(face, m_normals, normal_tolerance)) {
				face_backs[face_idx] = uint32_t(next & UINT32_MAX);
				face_backs[next] = face_idx;
				break;
			}
			next = face.next_face_idx(it->v0);
		}
	}

	create_edges();

	std::vector<uint32_t> adjacents;
	adjacents.reserve(512);
	std::vector<int> sides;
	sides.reserve(256);

	uint32_t* lgroups = new uint32_t[num_faces];
	xr_uninitialized_fill_n(lgroups, num_faces, BAD_IDX);

	uint32_t lgroup = 0;
	for (size_t k = 0; k != num_faces; ++k) {
		if (face_backs[k] == BAD_IDX || lgroups[k] != BAD_IDX)
			continue;
		int side = 0;
		face_idx = uint32_t(k & UINT32_MAX);
		lgroups[face_idx] = lgroup;
		lgroups[face_backs[face_idx]] = lgroup + 1;
		for (;;) {
			const b_face& face = m_faces[face_idx];
			for (uint_fast32_t i = 3, v0, v1 = face.v0; i != 0; v1 = v0) {
				b_edge* edge = find_edge(v0 = face.v[--i], v1);
				xr_assert(edge && (v0 == edge->v1 || v1 == edge->v1));
				if (edge->size > 4)
					continue;
				for (uint_fast32_t next = edge->face0; next != BAD_IDX;) {
					const b_face& adjacent = m_faces[next];
					if (next != face_idx && next != face_backs[face_idx] &&
							lgroups[next] == BAD_IDX) {
						bool same_layer = adjacent.is_same_layer(v0, v1);
						uint_fast32_t next_back = face_backs[next];
						if (next_back == BAD_IDX) {
							if (edge->size > 3)
								break;
							if (same_layer)
								--side;
							else
								++side;
						} else if (same_layer) {
							adjacents.push_back(uint32_t(next & UINT32_MAX));
							lgroups[next] = lgroup;
							lgroups[next_back] = lgroup + 1;
							break;
						} else {
							adjacents.push_back(uint32_t(next_back & UINT32_MAX));
							lgroups[next_back] = lgroup;
							lgroups[next] = lgroup + 1;
							break;
						}
					}

					// check for endless cycle. It`s in build 2232 l06_rostok
					uint_fast32_t temp = adjacent.next_face_idx(v0, v1);
					if (next == temp)
						break;
					next = temp;
				}
			}
			if (adjacents.empty())
				break;
			face_idx = adjacents.back();
			adjacents.pop_back();

		}
		if (side == 0)
			side = -1;
		sides.push_back(side);
		lgroup += 2;
	}

	face_idx = 0;
	b_face_vec_it last = m_faces.begin();
	for (b_face_vec_it it = last, end = m_faces.end(); it != end; ++it, ++face_idx) {
		if (face_backs[face_idx] != BAD_IDX) {
			int side = sides[(lgroup = lgroups[face_idx])/2];
			if (lgroup & 1)
				side = -side;
			if (side < 0)
				it->surface.flags |= RSF_TWO_SIDED;
			else
				continue;
		}
		if (last != it)
			*last = *it;
		++last;
	}
	m_faces.erase(last, m_faces.end());

	delete[] lgroups;
	delete[] face_backs;
}